

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O1

SUNErrCode SUNAdaptController_Reset_Soderlind(SUNAdaptController C)

{
  void *pvVar1;
  
  pvVar1 = C->content;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar1 + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar1 + 0x40) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar1 + 0x48) = 0x3ff0000000000000;
  *(undefined4 *)((long)pvVar1 + 0x50) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Reset_Soderlind(SUNAdaptController C)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_EP(C)         = SUN_RCONST(1.0);
  SODERLIND_EPP(C)        = SUN_RCONST(1.0);
  SODERLIND_HP(C)         = SUN_RCONST(1.0);
  SODERLIND_HPP(C)        = SUN_RCONST(1.0);
  SODERLIND_FIRSTSTEPS(C) = 0;
  return SUN_SUCCESS;
}